

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int is_supported_version(uint16_t v)

{
  uint16_t *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 8) {
      return 0;
    }
    puVar1 = (uint16_t *)((long)supported_versions + lVar2);
    lVar2 = lVar2 + 2;
  } while (*puVar1 != v);
  return 1;
}

Assistant:

static int is_supported_version(uint16_t v)
{
    size_t i;
    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
        if (supported_versions[i] == v)
            return 1;
    return 0;
}